

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_vsplt(DisasContext_conflict10 *ctx,int vece)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int bofs;
  int dofs;
  int uimm;
  TCGContext_conflict10 *tcg_ctx;
  int vece_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->altivec_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = UIMM5(ctx->opcode);
    uVar2 = rB(ctx->opcode);
    iVar3 = avr_full_offset(uVar2);
    uVar2 = rD(ctx->opcode);
    uVar2 = avr_full_offset(uVar2);
    tcg_gen_gvec_dup_mem_ppc64
              (tcg_ctx_00,vece,uVar2,
               ((1 << ((byte)vece & 0x1f)) - 1U ^ 0xffffffff) &
               ((uVar1 << ((byte)vece & 0x1f) & 0xf) + iVar3 ^ 0xf),0x10,0x10);
  }
  else {
    gen_exception(ctx,0x49);
  }
  return;
}

Assistant:

static void gen_vsplt(DisasContext *ctx, int vece)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int uimm, dofs, bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    uimm = UIMM5(ctx->opcode);
    bofs = avr_full_offset(rB(ctx->opcode));
    dofs = avr_full_offset(rD(ctx->opcode));

    /* Experimental testing shows that hardware masks the immediate.  */
    bofs += (uimm << vece) & 15;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 15;
    bofs &= ~((1 << vece) - 1);
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, vece, dofs, bofs, 16, 16);
}